

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_pack8_int8.h
# Opt level: O1

void ncnn::padding_constant_pack8_int8_sse
               (Mat *src,Mat *dst,int top,int bottom,int left,int right,int64_t _v)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int64_t *piVar4;
  void *pvVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  pvVar5 = src->data;
  piVar4 = (int64_t *)dst->data;
  if (0 < top) {
    iVar1 = dst->w;
    iVar2 = 0;
    do {
      iVar6 = iVar1;
      if (0 < iVar1) {
        do {
          *piVar4 = _v;
          piVar4 = piVar4 + 1;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != top);
  }
  iVar1 = src->h;
  if (0 < iVar1) {
    iVar2 = src->w;
    iVar6 = 0;
    do {
      iVar3 = left;
      if (0 < left) {
        do {
          *piVar4 = _v;
          piVar4 = piVar4 + 1;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      if (0 < iVar2) {
        lVar7 = 0;
        lVar8 = 0;
        do {
          piVar4[lVar8] = *(int64_t *)((long)pvVar5 + lVar8 * 8);
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + -8;
        } while (iVar2 != (int)lVar8);
        piVar4 = (int64_t *)((long)piVar4 - lVar7);
        pvVar5 = (void *)((long)pvVar5 - lVar7);
      }
      iVar3 = right;
      if (0 < right) {
        do {
          *piVar4 = _v;
          piVar4 = piVar4 + 1;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != iVar1);
  }
  if (0 < bottom) {
    iVar1 = dst->w;
    iVar2 = 0;
    do {
      iVar6 = iVar1;
      if (0 < iVar1) {
        do {
          *piVar4 = _v;
          piVar4 = piVar4 + 1;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != bottom);
  }
  return;
}

Assistant:

static void padding_constant_pack8_int8_sse(const Mat& src, Mat& dst, int top, int bottom, int left, int right, int64_t _v)
{
    const int64_t* ptr = src;
    int64_t* outptr = dst;

    // fill top
    for (int y = 0; y < top; y++)
    {
        for (int x = 0; x < dst.w; x++)
        {
            *outptr++ = _v;
        }
    }
    // fill center
    for (int y = 0; y < src.h; y++)
    {
        for (int x = 0; x < left; x++)
        {
            *outptr++ = _v;
        }
        for (int x = 0; x < src.w; x++)
        {
            *outptr++ = *ptr++;
        }
        for (int x = 0; x < right; x++)
        {
            *outptr++ = _v;
        }
    }
    // fill bottom
    for (int y = 0; y < bottom; y++)
    {
        for (int x = 0; x < dst.w; x++)
        {
            *outptr++ = _v;
        }
    }
}